

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentBG.cpp
# Opt level: O2

BGPolicyIndex __thiscall AgentBG::GetMaximizingBGIndex(AgentBG *this,JointBeliefInterface *jb)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  BGPolicyIndex BVar4;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  BGPolicyIndex bI;
  double local_40;
  BGPolicyIndex local_38;
  undefined1 auVar5 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  BVar4 = 0x7fffffff;
  uVar3 = 0;
  local_40 = -1.79769313486232e+308;
  while( true ) {
    uVar2 = (**(code **)((long)*(((this->super_AgentDelayedSharedObservations).
                                  super_AgentDecPOMDPDiscrete._m_pu)->super_PlanningUnitMADPDiscrete
                                )._m_madp + 0x68))();
    if (uVar2 == uVar3) break;
    if (this->_m_QBGstationary == (QAV<PerseusBGPlanner> *)0x0) {
      auVar7._0_8_ = (**(code **)(*(long *)(*(long *)(this->_m_QBGnonStationary + 8) + 0x18) + 0x58)
                     )(*(long *)(this->_m_QBGnonStationary + 8) + 0x18,jb,(int)this->_m_t,uVar3,
                       &local_38);
      auVar7._8_56_ = extraout_var_00;
      auVar5 = auVar7._0_16_;
    }
    else {
      lVar1 = *(long *)(this->_m_QBGstationary + 8);
      auVar6._0_8_ = (**(code **)(*(long *)(lVar1 + 0x18) + 0x48))(lVar1 + 0x18,jb,uVar3,&local_38);
      auVar6._8_56_ = extraout_var;
      auVar5 = auVar6._0_16_;
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_40;
    if (local_40 < auVar5._0_8_) {
      BVar4 = local_38;
    }
    auVar5 = vmaxsd_avx(auVar5,auVar8);
    uVar3 = uVar3 + 1;
    local_40 = auVar5._0_8_;
  }
  return BVar4;
}

Assistant:

AlphaVector::BGPolicyIndex
AgentBG::GetMaximizingBGIndex(const JointBeliefInterface &jb) const
{
    double v=-DBL_MAX,q;
    AlphaVector::BGPolicyIndex bI,betaMaxI=INT_MAX;

    for(Index a=0;a!=GetPU()->GetNrJointActions();++a)
    {
        if(_m_QBGstationary)
            q=_m_QBGstationary->GetQ(jb,a,bI);
        else
            q=_m_QBGnonStationary->GetQ(jb,_m_t,a,bI);

        if(q>v)
        {
            v=q;
            betaMaxI=bI;
        }
    }

#if DEBUG_AgentBG
    cout << "GetMaximizingBGIndex " << GetIndex() << ": betaMaxI " << betaMaxI 
         << " " << jb.SoftPrint() << endl;
#endif
    return(betaMaxI);
}